

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkGetCubePairNum(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x93,"int Abc_NtkGetCubePairNum(Abc_Ntk_t *)");
  }
  pVVar3 = pNtk->vObjs;
  if (pVVar3->nSize < 1) {
    uVar6 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar3->pArray[lVar5];
      if (((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
         (iVar1 = Abc_NodeIsConst(pNode), iVar1 == 0)) {
        if ((char *)(pNode->field_5).pData == (char *)0x0) {
          __assert_fail("pNode->pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                        ,0x98,"int Abc_NtkGetCubePairNum(Abc_Ntk_t *)");
        }
        uVar2 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
        if (1 < uVar2) {
          uVar6 = uVar6 + ((ulong)(((long)(int)uVar2 + -1) * (long)(int)uVar2) >> 1);
        }
      }
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar5 < pVVar3->nSize);
  }
  uVar4 = 0x40000000;
  if (uVar6 < 0x40000000) {
    uVar4 = uVar6;
  }
  return (int)uVar4;
}

Assistant:

int Abc_NtkGetCubePairNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    word nCubes, nCubePairs = 0;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_NodeIsConst(pNode) )
            continue;
        assert( pNode->pData );
        nCubes = (word)Abc_SopGetCubeNum( (char *)pNode->pData );
        if ( nCubes > 1 )
            nCubePairs += nCubes * (nCubes - 1) / 2;
    }
    return (int)(nCubePairs > (1<<30) ? (1<<30) : nCubePairs);
}